

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int link_set_max_link_credit(LINK_HANDLE link,uint32_t max_link_credit)

{
  int local_18;
  int result;
  uint32_t max_link_credit_local;
  LINK_HANDLE link_local;
  
  if (link == (LINK_HANDLE)0x0) {
    local_18 = 0x483;
  }
  else {
    link->max_link_credit = max_link_credit;
    local_18 = 0;
  }
  return local_18;
}

Assistant:

int link_set_max_link_credit(LINK_HANDLE link, uint32_t max_link_credit)
{
    int result;

    if (link == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        link->max_link_credit = max_link_credit;
        result = 0;
    }

    return result;
}